

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# calcdb.cc
# Opt level: O0

void __thiscall DbaseCtrlBlk::get_next_trans_ext(DbaseCtrlBlk *this)

{
  unsigned_long uVar1;
  ulong uVar2;
  unsigned_long res;
  DbaseCtrlBlk *this_local;
  
  uVar1 = this->cur_blk_size - (long)this->cur_buf_pos;
  if (uVar1 == 0) {
    this->cur_blk_size = 0;
  }
  else {
    memcpy(this->buf,this->buf + this->cur_buf_pos,uVar1 * 4);
    this->cur_blk_size = uVar1;
  }
  uVar2 = read(this->fd,this->buf + this->cur_blk_size,
               ((long)this->buf_size - this->cur_blk_size) * 4);
  this->cur_blk_size = uVar2 / 4 + this->cur_blk_size;
  this->cur_buf_pos = 0;
  return;
}

Assistant:

void DbaseCtrlBlk::get_next_trans_ext() {
    // Need to get more items from file
    auto res = cur_blk_size - cur_buf_pos;
    if (res > 0) {
        // First copy partial transaction to beginning of buffer
        memcpy((void *) buf,
               (void *) (buf + cur_buf_pos),
               res * INT_SIZE);
        cur_blk_size = res;
    } else {
        // No partial transaction in buffer
        cur_blk_size = 0;
    }

    res = read(fd, (void *) (buf + cur_blk_size), ((buf_size - cur_blk_size) * INT_SIZE));

    if (res < 0) {
        throw runtime_error("reading in database");
    }
    cur_blk_size += res / INT_SIZE;
    cur_buf_pos = 0;
}